

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

void print_range_internal(char *pre,int ndim,int *lo,int *hi,char *post)

{
  ulong uVar1;
  
  printf("%s[",pre);
  if (0 < ndim) {
    uVar1 = 0;
    do {
      printf("%d:%d",(ulong)(uint)lo[uVar1],(ulong)(uint)hi[uVar1]);
      if (ndim - 1 == uVar1) {
        printf("] %s",post);
      }
      else {
        putchar(0x2c);
      }
      uVar1 = uVar1 + 1;
    } while ((uint)ndim != uVar1);
  }
  return;
}

Assistant:

void print_range_internal(char *pre,int ndim, int lo[], int hi[], char* post)
{
    int i;

    printf("%s[",pre);
    for(i=0;i<ndim;i++){
        printf("%d:%d",lo[i],hi[i]);
        if(i==ndim-1)printf("] %s",post);
        else printf(",");
    }
}